

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::update_gl_camera(Application *this)

{
  Vector3D local_88;
  Vector3D *local_70;
  Vector3D *u;
  Vector3D **local_50;
  Vector3D *r;
  Vector3D **local_30;
  Vector3D *c;
  GLint view [4];
  Application *this_local;
  
  glGetIntegerv(0xba2,&c);
  if (((long)view[0] != this->screenW) || ((long)view[1] != this->screenH)) {
    (*(this->super_Renderer)._vptr_Renderer[4])(this,(long)view[0],(long)view[1]);
  }
  glMatrixMode(0x1700);
  glLoadIdentity();
  Camera::position((Vector3D *)&r,&this->camera);
  local_30 = &r;
  Camera::view_point((Vector3D *)&u,&this->camera);
  local_50 = &u;
  Camera::up_dir(&local_88,&this->camera);
  local_70 = &local_88;
  gluLookAt(*local_30,local_30[1],local_30[2],*local_50,local_50[1],local_50[2],local_88.x,
            local_88.y);
  return;
}

Assistant:

void Application::update_gl_camera() {

  // Call resize() every time we draw, since it doesn't seem
  // to get called by the Viewer upon initial window creation
  // (this should probably be fixed!).
  GLint view[4];
  glGetIntegerv(GL_VIEWPORT, view);
  if (view[2] != screenW || view[3] != screenH) {
    resize(view[2], view[3]);
  }

  // Control the camera to look at the mesh.
  glMatrixMode(GL_MODELVIEW);
  glLoadIdentity();

  const Vector3D& c = camera.position();
  const Vector3D& r = camera.view_point();
  const Vector3D& u = camera.up_dir();

  gluLookAt(c.x, c.y, c.z,
            r.x, r.y, r.z,
            u.x, u.y, u.z);
}